

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_64bit_generated.h
# Opt level: O1

Offset<RootTable>
CreateRootTableDirect
          (FlatBufferBuilder64 *_fbb,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *far_vector,int32_t a,
          char *far_string,vector<unsigned_char,_std::allocator<unsigned_char>_> *big_vector,
          char *near_string,vector<unsigned_char,_std::allocator<unsigned_char>_> *nested_root,
          vector<LeafStruct,_std::allocator<LeafStruct>_> *far_struct_vector,
          vector<LeafStruct,_std::allocator<LeafStruct>_> *big_struct_vector,
          vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
          *many_vectors,vector<unsigned_char,_std::allocator<unsigned_char>_> *forced_aligned_vector
          )

{
  pointer puVar1;
  LeafStruct *pLVar2;
  unsigned_long uVar3;
  Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_> off;
  uoffset_t uVar4;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_> off_00;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> off_01;
  size_t len;
  size_t sVar5;
  long lVar6;
  uchar *puVar7;
  LeafStruct *pLVar8;
  uchar *puVar9;
  Offset<WrapperTable> *v;
  Offset<flatbuffers::String> off_02;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_70;
  Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_> local_60;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> local_58;
  Offset64<flatbuffers::String> local_48;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_> local_40;
  
  if (far_vector == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    local_40.o = 0;
  }
  else {
    puVar1 = (far_vector->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    sVar5 = (long)(far_vector->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    puVar7 = &flatbuffers::
              data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
              ::t;
    if (sVar5 != 0) {
      puVar7 = puVar1;
    }
    local_40 = flatbuffers::FlatBufferBuilderImpl<true>::
               CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector>
                         (_fbb,puVar7,sVar5);
  }
  if (far_string == (char *)0x0) {
    local_48.o = 0;
  }
  else {
    local_48 = flatbuffers::FlatBufferBuilderImpl<true>::CreateString<flatbuffers::Offset64>
                         (_fbb,far_string);
  }
  if (big_vector == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    local_58.o = 0;
  }
  else {
    puVar7 = (big_vector->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    sVar5 = (long)(big_vector->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
    puVar9 = &flatbuffers::
              data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
              ::t;
    if (sVar5 != 0) {
      puVar9 = puVar7;
    }
    local_58 = flatbuffers::FlatBufferBuilderImpl<true>::
               CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                         (_fbb,puVar9,sVar5);
  }
  if (nested_root == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    local_70.o = 0;
  }
  else {
    puVar7 = (nested_root->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
    sVar5 = (long)(nested_root->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar7;
    puVar9 = &flatbuffers::
              data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
              ::t;
    if (sVar5 != 0) {
      puVar9 = puVar7;
    }
    local_70 = flatbuffers::FlatBufferBuilderImpl<true>::
               CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                         (_fbb,puVar9,sVar5);
  }
  if (far_struct_vector == (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0) {
    local_60.o = 0;
  }
  else {
    pLVar2 = (far_struct_vector->super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(far_struct_vector->super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2;
    pLVar8 = (LeafStruct *)
             &flatbuffers::
              data<LeafStruct,std::allocator<LeafStruct>>(std::vector<LeafStruct,std::allocator<LeafStruct>>const&)
              ::t;
    if (lVar6 != 0) {
      pLVar8 = pLVar2;
    }
    local_60 = flatbuffers::FlatBufferBuilderImpl<true>::
               CreateVectorOfStructs<LeafStruct,_flatbuffers::Offset64,_flatbuffers::Vector>
                         (_fbb,pLVar8,lVar6 >> 4);
  }
  if (big_struct_vector == (vector<LeafStruct,_std::allocator<LeafStruct>_> *)0x0) {
    off_00.o = 0;
  }
  else {
    pLVar2 = (big_struct_vector->super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(big_struct_vector->super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pLVar2;
    pLVar8 = (LeafStruct *)
             &flatbuffers::
              data<LeafStruct,std::allocator<LeafStruct>>(std::vector<LeafStruct,std::allocator<LeafStruct>>const&)
              ::t;
    if (lVar6 != 0) {
      pLVar8 = pLVar2;
    }
    off_00 = flatbuffers::FlatBufferBuilderImpl<true>::
             CreateVectorOfStructs<LeafStruct,_flatbuffers::Offset64,_flatbuffers::Vector64>
                       (_fbb,pLVar8,lVar6 >> 4);
  }
  off_02.o = 0;
  if (forced_aligned_vector == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    off_01.o = 0;
  }
  else {
    flatbuffers::FlatBufferBuilderImpl<true>::ForceVectorAlignment64<true>
              (_fbb,(long)(forced_aligned_vector->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                    (long)(forced_aligned_vector->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_start,1,0x20);
    puVar7 = (forced_aligned_vector->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = (long)(forced_aligned_vector->
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar7;
    puVar9 = &flatbuffers::
              data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
              ::t;
    if (sVar5 != 0) {
      puVar9 = puVar7;
    }
    off_01 = flatbuffers::FlatBufferBuilderImpl<true>::
             CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                       (_fbb,puVar9,sVar5);
  }
  if (near_string != (char *)0x0) {
    len = strlen(near_string);
    flatbuffers::FlatBufferBuilderImpl<true>::CreateStringImpl(_fbb,near_string,len);
    off_02.o = (int)(_fbb->buf_).size_ - (int)_fbb->length_of_64_bit_region_;
  }
  if (many_vectors ==
      (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
       *)0x0) {
    off.o = 0;
  }
  else {
    lVar6 = *(long *)(many_vectors + 8) - (long)*(Offset<WrapperTable> **)many_vectors;
    v = (Offset<WrapperTable> *)
        &flatbuffers::
         data<flatbuffers::Offset<WrapperTable>,std::allocator<flatbuffers::Offset<WrapperTable>>>(std::vector<flatbuffers::Offset<WrapperTable>,std::allocator<flatbuffers::Offset<WrapperTable>>>const&)
         ::t;
    if (lVar6 != 0) {
      v = *(Offset<WrapperTable> **)many_vectors;
    }
    off = flatbuffers::FlatBufferBuilderImpl<true>::CreateVector<WrapperTable>(_fbb,v,lVar6 >> 2);
  }
  flatbuffers::FlatBufferBuilderImpl<true>::NotNested(_fbb);
  _fbb->nested = true;
  uVar3 = (_fbb->buf_).size_;
  sVar5 = _fbb->length_of_64_bit_region_;
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>(_fbb,0x16,off_01);
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>(_fbb,0x12,off_00);
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>(_fbb,0xe,local_70);
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>(_fbb,10,local_58);
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>(_fbb,0x14,off);
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>(_fbb,0x10,local_60);
  flatbuffers::FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(_fbb,0xc,off_02);
  flatbuffers::FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(_fbb,8,local_48);
  flatbuffers::FlatBufferBuilderImpl<true>::AddElement<int>(_fbb,6,a,0);
  flatbuffers::FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,4,local_40);
  uVar4 = flatbuffers::FlatBufferBuilderImpl<true>::EndTable(_fbb,(int)uVar3 - (int)sVar5);
  return (Offset<RootTable>)uVar4;
}

Assistant:

inline ::flatbuffers::Offset<RootTable> CreateRootTableDirect(
    ::flatbuffers::FlatBufferBuilder64 &_fbb,
    const std::vector<uint8_t> *far_vector = nullptr,
    int32_t a = 0,
    const char *far_string = nullptr,
    const std::vector<uint8_t> *big_vector = nullptr,
    const char *near_string = nullptr,
    const std::vector<uint8_t> *nested_root = nullptr,
    const std::vector<LeafStruct> *far_struct_vector = nullptr,
    const std::vector<LeafStruct> *big_struct_vector = nullptr,
    const std::vector<::flatbuffers::Offset<WrapperTable>> *many_vectors = nullptr,
    const std::vector<uint8_t> *forced_aligned_vector = nullptr) {
  auto far_vector__ = far_vector ? _fbb.CreateVector64<::flatbuffers::Vector>(*far_vector) : 0;
  auto far_string__ = far_string ? _fbb.CreateString<::flatbuffers::Offset64>(far_string) : 0;
  auto big_vector__ = big_vector ? _fbb.CreateVector64(*big_vector) : 0;
  auto nested_root__ = nested_root ? _fbb.CreateVector64(*nested_root) : 0;
  auto far_struct_vector__ = far_struct_vector ? _fbb.CreateVectorOfStructs64<::flatbuffers::Vector>(*far_struct_vector) : 0;
  auto big_struct_vector__ = big_struct_vector ? _fbb.CreateVectorOfStructs64(*big_struct_vector) : 0;
  if (forced_aligned_vector) { _fbb.ForceVectorAlignment64(forced_aligned_vector->size(), sizeof(uint8_t), 32); }
  auto forced_aligned_vector__ = forced_aligned_vector ? _fbb.CreateVector64(*forced_aligned_vector) : 0;
  auto near_string__ = near_string ? _fbb.CreateString(near_string) : 0;
  auto many_vectors__ = many_vectors ? _fbb.CreateVector<::flatbuffers::Offset<WrapperTable>>(*many_vectors) : 0;
  return CreateRootTable(
      _fbb,
      far_vector__,
      a,
      far_string__,
      big_vector__,
      near_string__,
      nested_root__,
      far_struct_vector__,
      big_struct_vector__,
      many_vectors__,
      forced_aligned_vector__);
}